

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void storeRange(uint32_t start,uint32_t end,UStringPrepType type,UErrorCode *status)

{
  UNewDataMemory *pos;
  uint16_t *puVar1;
  UBool UVar2;
  int16_t iVar3;
  uint32_t uVar4;
  int iVar5;
  uint extraout_EAX;
  size_t sVar6;
  UNewDataMemory *pUVar7;
  UHashElement *pUVar8;
  UNewDataMemory *pUVar9;
  int iVar10;
  uint32_t extraout_EDX;
  int32_t count;
  UNewDataMemory *unaff_RBX;
  uint uVar11;
  undefined4 in_register_00000034;
  UNewDataMemory *__s;
  UNewTrie *pUVar13;
  char *pcVar14;
  uint uVar15;
  UNewDataMemory *unaff_R12;
  UChar32 UVar16;
  UNewDataMemory *unaff_R15;
  UNewDataMemory *pUVar17;
  UNewDataMemory *pUVar18;
  UNewDataMemory *pUVar19;
  char cStack_a9;
  UNewDataMemory *pUStack_a8;
  UNewDataMemory *pUStack_a0;
  UNewDataMemory *pUStack_98;
  UNewDataMemory *pUStack_90;
  UNewDataMemory *pUStack_88;
  undefined1 auStack_80 [16];
  ulong uStack_70;
  uint uStack_64;
  UNewDataMemory *pUStack_60;
  UNewDataMemory *pUStack_58;
  char *pcStack_50;
  UNewDataMemory *pUStack_48;
  UNewDataMemory *pUVar12;
  
  __s = (UNewDataMemory *)CONCAT44(in_register_00000034,end);
  uVar11 = type + 0xfff0;
  pUVar12 = (UNewDataMemory *)(ulong)uVar11;
  if ((int)uVar11 < 0x10000) {
    unaff_RBX = (UNewDataMemory *)(ulong)start;
    pUVar13 = sprepTrie;
    if (start != end) {
LAB_0010a3b1:
      UVar2 = utrie_setRange32_63(pUVar13,start,end + 1,uVar11 & 0xffff,'\0');
      if (UVar2 != '\0') {
        return;
      }
      storeRange_cold_1();
LAB_0010a3d5:
      __s = unaff_RBX;
      UVar2 = utrie_set32_63(sprepTrie,start,uVar11 & 0xffff);
      if (UVar2 != '\0') {
        return;
      }
      goto LAB_0010a3f1;
    }
    __s = unaff_RBX;
    uVar4 = utrie_get32_63(sprepTrie,start,(UBool *)0x0);
    if (uVar4 == 0) goto LAB_0010a3d5;
    if (type == USPREP_PROHIBITED && uVar4 < 0xfff0) {
      if (uVar4 < 0xffef) {
        pUVar13 = sprepTrie;
        UVar2 = utrie_set32_63(sprepTrie,start,uVar4 + 1);
        if (UVar2 != '\0') {
          return;
        }
        storeRange_cold_4();
        end = extraout_EDX;
        goto LAB_0010a3b1;
      }
      goto LAB_0010a3f8;
    }
    if (uVar4 == (uVar11 & 0xffff)) goto LAB_0010a3d5;
  }
  else {
    storeRange_cold_6();
LAB_0010a3f1:
    storeRange_cold_5();
LAB_0010a3f8:
    storeRange_cold_3();
  }
  pcVar14 = (char *)((ulong)unaff_RBX & 0xffffffff);
  storeRange_cold_2();
  pUVar18 = (UNewDataMemory *)auStack_80;
  pUVar19 = (UNewDataMemory *)auStack_80;
  auStack_80._0_4_ = U_ZERO_ERROR;
  pUStack_88 = (UNewDataMemory *)0x10a429;
  pcStack_50 = pcVar14;
  pUStack_48 = unaff_RBX;
  sVar6 = strlen((char *)__s);
  pUStack_88 = (UNewDataMemory *)0x10a432;
  pUStack_60 = (UNewDataMemory *)uprv_malloc_63(sVar6 + 100);
  auStack_80._12_4_ = 0xffffffff;
  if (hashTable != (UHashtable *)0x0) {
    pUStack_88 = (UNewDataMemory *)0x10a454;
    uVar11 = uhash_count_63(hashTable);
    unaff_RBX = (UNewDataMemory *)(ulong)uVar11;
    pUStack_88 = (UNewDataMemory *)0x10a467;
    mappingData = (uint16_t *)uprv_calloc_63((long)mappingDataCapacity,2);
    uStack_64 = uVar11;
    if ((int)uVar11 < 1) {
      pUVar9 = (UNewDataMemory *)0x1;
    }
    else {
      uStack_70 = 0;
      pos = (UNewDataMemory *)(auStack_80 + 0xc);
      pUVar12 = (UNewDataMemory *)0x0;
      pUVar17 = (UNewDataMemory *)0x0;
      pUStack_58 = __s;
      pUVar9 = (UNewDataMemory *)0x1;
LAB_0010a49a:
      do {
        pUVar7 = pUVar9;
        pUStack_88 = (UNewDataMemory *)0x10a4a9;
        pUVar8 = uhash_nextElement_63(hashTable,(int32_t *)pos);
        unaff_RBX = pos;
        unaff_R15 = pUVar17;
        if (pUVar8 != (UHashElement *)0x0) {
          UVar16 = (pUVar8->key).integer;
          __s = (UNewDataMemory *)(pUVar8->value).pointer;
          if (pUVar7 != pUVar12) {
            if ((int)pUVar12 < 4) {
              uVar11 = (uint)currentIndex;
              indexes[(long)((long)&pUVar7->file + 2)] = uVar11;
              uStack_70 = uStack_70 & 0xffffffff;
              if (pUVar7 == (UNewDataMemory *)0x4) {
                uStack_70 = (ulong)uVar11;
              }
            }
            pUVar12 = (UNewDataMemory *)((ulong)pUVar7 & 0xffffffff);
          }
          pUVar9 = pUVar7;
          if (pUVar7 != (UNewDataMemory *)(ulong)(uint)(int)(short)__s->headerSize)
          goto LAB_0010a49a;
          auStack_80._4_4_ = SUB84(pUVar12,0);
          uVar15 = (uint)(ushort)currentIndex;
          unaff_R12 = (UNewDataMemory *)(ulong)uVar15;
          uVar11 = uVar15 * 4 + 2;
          unaff_RBX = (UNewDataMemory *)(ulong)uVar11;
          pUVar12 = pUVar17;
          unaff_R15 = pos;
          if ((ushort)uVar11 < 0xfff1) {
            pUStack_88 = (UNewDataMemory *)0x10a52e;
            auStack_80._8_4_ = UVar16;
            uVar4 = utrie_get32_63(sprepTrie,UVar16,(UBool *)0x0);
            if (uVar4 == 0) {
LAB_0010a548:
              pUStack_88 = (UNewDataMemory *)0x10a55b;
              UVar2 = utrie_set32_63(sprepTrie,auStack_80._8_4_,(uint)unaff_RBX & 0xffff);
              puVar1 = mappingData;
              if (UVar2 == '\0') goto LAB_0010a7de;
              iVar5 = (int)currentIndex;
              count = (int32_t)(short)__s->headerSize;
              if (0x3fbe < count + iVar5) goto LAB_0010a7d9;
              iVar3 = currentIndex;
              if ((UNewDataMemory *)0x3 < pUVar7) {
                iVar3 = currentIndex + 1;
                currentIndex = iVar3;
                mappingData[iVar5] = (uint16_t)pUVar7;
                count = (int32_t)(short)__s->headerSize;
              }
              pUVar12 = (UNewDataMemory *)(ulong)(uint)auStack_80._4_4_;
              pUStack_88 = (UNewDataMemory *)0x10a5bb;
              u_memmove_63((UChar *)(puVar1 + iVar3),(UChar *)__s->file,count);
              currentIndex = currentIndex + __s->headerSize;
              unaff_RBX = pos;
              unaff_R15 = pUVar17;
              if (mappingDataCapacity < currentIndex) goto LAB_0010a7d4;
              pUVar17 = (UNewDataMemory *)(ulong)((int)pUVar17 + 1);
              goto LAB_0010a49a;
            }
            if (uVar4 == 0xfff2) {
              unaff_RBX = (UNewDataMemory *)(ulong)(uVar15 << 2 | 3);
              unaff_R12 = unaff_RBX;
              goto LAB_0010a548;
            }
          }
          else {
            pUStack_88 = (UNewDataMemory *)0x10a7d4;
            generateData_cold_5();
LAB_0010a7d4:
            pUStack_88 = (UNewDataMemory *)0x10a7d9;
            generateData_cold_1();
LAB_0010a7d9:
            pUStack_88 = (UNewDataMemory *)0x10a7de;
            generateData_cold_2();
LAB_0010a7de:
            pUStack_88 = (UNewDataMemory *)0x10a7e3;
            generateData_cold_3();
          }
          pUStack_88 = (UNewDataMemory *)0x10a7ec;
          generateData_cold_4();
          goto LAB_0010a7ec;
        }
        pUVar9 = (UNewDataMemory *)((long)&pUVar7->file + 1);
        auStack_80._12_4_ = 0xffffffff;
      } while ((int)pUVar17 < (int)uStack_64);
      __s = pUStack_58;
      if ((UNewDataMemory *)0x2 < pUVar7) {
        indexes[6] = (int32_t)uStack_70;
        goto LAB_0010a62b;
      }
    }
    indexes[(long)((long)&pUVar9->file + 2)] = currentIndex + 1;
  }
LAB_0010a62b:
  pUStack_88 = (UNewDataMemory *)0x10a656;
  uVar11 = utrie_serialize_63(sprepTrie,generateData::sprepTrieBlock,100000,getFoldedValue,'\x01',
                              (UErrorCode *)auStack_80);
  if ((int)auStack_80._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
    unaff_R12 = (UNewDataMemory *)(ulong)uVar11;
    uVar15 = uVar11 + mappingDataCapacity * 2 + 0x40;
    pUVar12 = (UNewDataMemory *)(ulong)uVar15;
    if (beVerbose != '\0') {
      pUStack_88 = (UNewDataMemory *)0x10a68f;
      printf("size of sprep trie              %5u bytes\n",unaff_R12);
      pUStack_88 = (UNewDataMemory *)0x10a6a3;
      printf("size of icudt63l_%s.spp contents: %ld bytes\n",__s,(long)(int)uVar15);
      pUStack_88 = (UNewDataMemory *)0x10a6b9;
      printf("size of mapping data array %5u bytes\n",(ulong)(uint)(mappingDataCapacity * 2));
      pUStack_88 = (UNewDataMemory *)0x10a6ce;
      printf("Number of code units in mappingData (currentIndex) are: %i \n",
             (ulong)(uint)(int)currentIndex);
      pUStack_88 = (UNewDataMemory *)0x10a6e2;
      printf("Maximum length of the mapping string is : %i \n",(ulong)(uint)maxLength);
    }
    unaff_RBX = pUStack_60;
    *(undefined1 *)&pUStack_60->file = 0;
    pUStack_88 = (UNewDataMemory *)0x10a6f5;
    strcat((char *)pUStack_60,(char *)__s);
    pcVar14 = (char *)0x0;
    if (haveCopyright != '\0') {
      pcVar14 = 
      " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
    }
    pUStack_88 = (UNewDataMemory *)0x10a72e;
    pUVar9 = udata_create(pcStack_50,"spp",(char *)unaff_RBX,&dataInfo,pcVar14,
                          (UErrorCode *)auStack_80);
    unaff_R15 = (UNewDataMemory *)auStack_80;
    if (U_ZERO_ERROR < (int)auStack_80._0_4_) goto LAB_0010a7f4;
    indexes[1] = mappingDataCapacity * 2;
    pUStack_88 = (UNewDataMemory *)0x10a765;
    indexes[0] = uVar11;
    udata_writeBlock(pUVar9,indexes,0x40);
    pUStack_88 = (UNewDataMemory *)0x10a777;
    udata_writeBlock(pUVar9,generateData::sprepTrieBlock,uVar11);
    pUStack_88 = (UNewDataMemory *)0x10a78c;
    udata_writeBlock(pUVar9,mappingData,indexes[1]);
    pUStack_88 = (UNewDataMemory *)0x10a79a;
    uVar11 = udata_finish(pUVar9,(UErrorCode *)auStack_80);
    if ((int)auStack_80._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
      if (uVar11 == uVar15) {
        if (hashTable != (UHashtable *)0x0) {
          pUStack_88 = (UNewDataMemory *)0x10a7b6;
          uhash_close_63(hashTable);
        }
        pUStack_88 = (UNewDataMemory *)0x10a7c0;
        uprv_free_63(pUStack_60);
        return;
      }
      goto LAB_0010a804;
    }
  }
  else {
LAB_0010a7ec:
    pUStack_88 = (UNewDataMemory *)0x10a7f4;
    generateData_cold_9();
LAB_0010a7f4:
    pUVar18 = unaff_R15;
    pUVar9 = __s;
    pUStack_88 = (UNewDataMemory *)0x10a7fc;
    generateData_cold_8();
  }
  pUStack_88 = (UNewDataMemory *)0x10a804;
  generateData_cold_7();
  pUVar19 = pUVar18;
  uVar11 = extraout_EAX;
LAB_0010a804:
  pUVar13 = (UNewTrie *)(ulong)uVar11;
  UVar16 = (UChar32)pUVar12;
  pUStack_88 = (UNewDataMemory *)getFoldedValue;
  generateData_cold_6();
  iVar5 = UVar16 + 0x400;
  pUStack_a8 = unaff_RBX;
  pUStack_a0 = unaff_R12;
  pUStack_98 = pUVar9;
  pUStack_90 = pUVar19;
  pUStack_88 = pUVar12;
  while( true ) {
    uVar4 = utrie_get32_63(pUVar13,UVar16,&cStack_a9);
    iVar10 = 0x20;
    if ((cStack_a9 == '\0') && (iVar10 = 1, uVar4 != 0)) break;
    UVar16 = UVar16 + iVar10;
    if (iVar5 <= UVar16) {
      return;
    }
  }
  return;
}

Assistant:

extern void
storeRange(uint32_t start, uint32_t end, UStringPrepType type,UErrorCode* status){
    uint16_t trieWord = 0;

    if((int)(_SPREP_TYPE_THRESHOLD + type) > 0xFFFF){
        fprintf(stderr,"trieWord cannot contain value greater than 0xFFFF.\n");
        exit(U_ILLEGAL_CHAR_FOUND);
    }
    trieWord = (_SPREP_TYPE_THRESHOLD + type); /* the top 4 bits contain the value */
    if(start == end){
        uint32_t savedTrieWord = utrie_get32(sprepTrie, start, NULL);
        if(savedTrieWord>0){
            if(savedTrieWord < _SPREP_TYPE_THRESHOLD && type == USPREP_PROHIBITED){
                /* 
                 * A mapping is stored in the trie word 
                 * and the only other possible type that a 
                 * code point can have is USPREP_PROHIBITED
                 *
                 */

                /* turn on the 0th bit in the savedTrieWord */
                savedTrieWord += 0x01;

                /* the downcast is safe since we only save 16 bit values */
                trieWord = (uint16_t)savedTrieWord;

                /* make sure that the value of trieWord is less than the threshold */
                if(trieWord < _SPREP_TYPE_THRESHOLD){   
                    /* now set the value in the trie */
                    if(!utrie_set32(sprepTrie,start,trieWord)){
                        fprintf(stderr,"Could not set the value for code point.\n");
                        exit(U_ILLEGAL_ARGUMENT_ERROR);   
                    }
                    /* value is set so just return */
                    return;
                }else{
                    fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
                    exit(U_ILLEGAL_CHAR_FOUND);
                }
 
            }else if(savedTrieWord != trieWord){
                fprintf(stderr,"Value for codepoint \\U%08X already set!.\n", (int)start);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }
            /* if savedTrieWord == trieWord .. fall through and set the value */
        }
        if(!utrie_set32(sprepTrie,start,trieWord)){
            fprintf(stderr,"Could not set the value for code point \\U%08X.\n", (int)start);
            exit(U_ILLEGAL_ARGUMENT_ERROR);   
        }
    }else{
        if(!utrie_setRange32(sprepTrie, start, end+1, trieWord, FALSE)){
            fprintf(stderr,"Value for certain codepoint already set.\n");
            exit(U_ILLEGAL_CHAR_FOUND);   
        }
    }

}